

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removedVecs(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int *perm)

{
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  undefined8 *puVar1;
  pointer pnVar2;
  undefined8 uVar3;
  long lVar4;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  ulong uVar6;
  uint *puVar7;
  uint *puVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  
  pSVar5 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  this_00 = &pSVar5->weights;
  if ((pSVar5->theType == ENTER) &&
     (uVar9 = (uint)((ulong)((long)(pSVar5->weights).val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pSVar5->weights).val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 7), 0 < (int)uVar9))
  {
    lVar10 = 0x1e;
    uVar6 = 0;
    do {
      lVar11 = (long)perm[uVar6];
      if (-1 < lVar11) {
        pnVar2 = (this_00->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar1 = (undefined8 *)((long)&(pnVar2->m_backend).data + lVar10 * 4);
        puVar7 = (uint *)(puVar1 + -0xf);
        puVar8 = (uint *)(pnVar2 + lVar11);
        for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
          *puVar8 = *puVar7;
          puVar7 = puVar7 + 1;
          puVar8 = puVar8 + 1;
        }
        pnVar2[lVar11].m_backend.exp = *(int *)(puVar1 + -1);
        pnVar2[lVar11].m_backend.neg = *(bool *)((long)puVar1 + -4);
        uVar3 = *puVar1;
        pnVar2[lVar11].m_backend.fpclass = (int)uVar3;
        pnVar2[lVar11].m_backend.prec_elem = (int)((ulong)uVar3 >> 0x20);
      }
      uVar6 = uVar6 + 1;
      lVar10 = lVar10 + 0x20;
    } while ((uVar9 & 0x7fffffff) != uVar6);
    pSVar5 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(this_00,(pSVar5->thevectors->set).thenum,true);
  return;
}

Assistant:

void SPxSteepPR<R>::removedVecs(const int perm[])
{
   assert(this->thesolver != nullptr);
   VectorBase<R>& weights = this->thesolver->weights;

   if(this->thesolver->type() == SPxSolverBase<R>::ENTER)
   {
      int i;
      int j = weights.dim();

      for(i = 0; i < j; ++i)
      {
         if(perm[i] >= 0)
            weights[perm[i]] = weights[i];
      }
   }

   weights.reDim(this->thesolver->coDim());
}